

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O2

void ecs_measure_frame_time(ecs_world_t *world,_Bool enable)

{
  _Bool _Var1;
  
  _ecs_assert(world->magic == 0x65637377,0x1a,(char *)0x0,"world->magic == ECS_WORLD_MAGIC",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x2a0);
  if (world->magic != 0x65637377) {
    __assert_fail("world->magic == (0x65637377)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x2a0,"void ecs_measure_frame_time(ecs_world_t *, _Bool)");
  }
  _Var1 = ecs_os_has_time();
  _ecs_assert(_Var1,0x20,(char *)0x0,"ecs_os_has_time()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x2a1);
  _Var1 = ecs_os_has_time();
  if (_Var1) {
    if ((world->stats).target_fps == 0.0 || enable) {
      world->measure_frame_time = enable;
    }
    return;
  }
  __assert_fail("ecs_os_has_time()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x2a1,"void ecs_measure_frame_time(ecs_world_t *, _Bool)");
}

Assistant:

void ecs_measure_frame_time(
    ecs_world_t *world,
    bool enable)
{
    ecs_assert(world->magic == ECS_WORLD_MAGIC, ECS_INVALID_FROM_WORKER, NULL);
    ecs_assert(ecs_os_has_time(), ECS_MISSING_OS_API, NULL);

    if (world->stats.target_fps == 0.0 || enable) {
        world->measure_frame_time = enable;
    }
}